

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O3

QString * __thiscall
ExportDirWrapper::getName(QString *__return_storage_ptr__,ExportDirWrapper *this)

{
  int *piVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QString t;
  QString libName;
  QString local_50;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  
  QVar2.m_data = (storage_type *)0x6;
  QVar2.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar2);
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_38;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uStack_34;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uStack_30;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_2c;
  (__return_storage_ptr__->d).size = local_28;
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])(&local_38,this)
  ;
  if (-1 < local_28) {
    QVar3.m_data = (storage_type *)0x2;
    QVar3.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar3);
    QString::append(&local_50);
    QString::append(__return_storage_ptr__);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,8);
      }
    }
  }
  piVar1 = (int *)CONCAT44(uStack_34,local_38);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_34,local_38),2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString ExportDirWrapper::getName()
{
    QString infoName = "Export";
    QString libName = this->getLibraryName();
    if (libName.length() >= 0) {
        infoName += ": "+ libName;
    }
    return infoName;
}